

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void pnga_matmul_basic(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                      Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
                      Integer *chi)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  logical lVar5;
  long lVar6;
  void *__ptr;
  void *__ptr_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 in_RDX;
  char *in_RSI;
  char *in_RDI;
  Integer in_R8;
  long *in_R9;
  long *in_stack_00000008;
  Integer in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  Integer in_stack_00000028;
  long *in_stack_00000030;
  long *in_stack_00000038;
  int in;
  int istart;
  Integer size_c;
  Integer size_b;
  Integer size_a;
  void *c_buf;
  void *b_buf;
  void *a_buf;
  Integer ld;
  Integer elemsize;
  Integer offset;
  Integer num_blocks;
  int local_sync_end;
  int local_sync_begin;
  _iterator_hdl hdl_c;
  char *src_ptr;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  SingleComplex ONE_F;
  DoubleComplex ONE_Z;
  Integer hiB [7];
  Integer loB [7];
  Integer hiA [7];
  Integer loA [7];
  Integer nlo;
  Integer lC [7];
  Integer hit [7];
  Integer lot [7];
  Integer hiC [7];
  Integer loC [7];
  Integer crank;
  Integer brank;
  Integer arank;
  Integer cdim;
  Integer bdim;
  Integer adim;
  Integer nb;
  Integer k;
  Integer m;
  Integer n;
  Integer tmpld [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  Integer ctype;
  Integer btype;
  Integer atype;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  char **in_stack_fffffffffffff850;
  int in_stack_fffffffffffff858;
  int in_stack_fffffffffffff85c;
  Integer *in_stack_fffffffffffff860;
  _iterator_hdl *in_stack_fffffffffffff868;
  long local_758;
  _iterator_hdl *in_stack_fffffffffffff8d8;
  Integer in_stack_fffffffffffff8e0;
  Integer in_stack_fffffffffffff9a8;
  char *in_stack_fffffffffffff9b0;
  Integer *in_stack_fffffffffffff9c0;
  void *in_stack_fffffffffffff9c8;
  Integer *in_stack_fffffffffffff9d0;
  Integer *in_stack_fffffffffffff9d8;
  Integer in_stack_fffffffffffff9e0;
  Integer *in_stack_fffffffffffffa18;
  Integer *in_stack_fffffffffffffa20;
  Integer *in_stack_fffffffffffffa28;
  Integer in_stack_fffffffffffffa30;
  long local_448;
  undefined1 local_440 [8];
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  undefined4 local_410;
  undefined4 local_40c;
  undefined8 local_408;
  undefined8 local_400;
  long local_3f8;
  long local_3f0;
  long local_3b8;
  long local_3b0;
  long local_378;
  long local_370;
  void *in_stack_fffffffffffffc98;
  Integer *in_stack_fffffffffffffca0;
  Integer *in_stack_fffffffffffffca8;
  Integer in_stack_fffffffffffffcb0;
  long local_2f8;
  long local_2b8 [8];
  long local_278 [8];
  Integer local_238 [8];
  long local_1f8 [8];
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_128 [8];
  long local_e8 [8];
  long local_a8 [8];
  long local_68;
  long local_60;
  long local_58;
  long *local_50;
  Integer local_48;
  undefined8 local_38;
  char *local_30;
  char *local_28;
  
  iVar2 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  local_408 = 0x3ff0000000000000;
  local_400 = 0;
  local_410 = 0x3f800000;
  local_40c = 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_50 = in_R9;
  local_48 = in_R8;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  if (iVar4 != 0) {
    pnga_sync();
  }
  if ((((*local_28 == 't') || (*local_28 == 'T')) || (*local_30 == 't')) || (*local_30 == 'T')) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  lVar5 = pnga_is_mirrored(local_48);
  if (((lVar5 != 0) || (lVar5 = pnga_is_mirrored(in_stack_00000010), lVar5 != 0)) ||
     (lVar5 = pnga_is_mirrored(in_stack_00000028), lVar5 != 0)) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  pnga_inquire(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
  pnga_inquire(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
  pnga_inquire(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
  if (local_1a8 != 2) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  if (local_1b0 != 2) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  if (local_1b8 != 2) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  if ((local_58 != local_60) || (local_58 != local_68)) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  if ((((local_58 != 0x3ef) && (local_58 != 0x3ec)) && (local_58 != 0x3eb)) && (local_58 != 0x3ee))
  {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  for (local_170 = 0; local_170 < local_1a8; local_170 = local_170 + 1) {
    if (((local_50[local_170] < 1) || (local_a8[local_170] < local_50[local_170])) ||
       ((in_stack_00000008[local_170] < 1 || (local_a8[local_170] < in_stack_00000008[local_170]))))
    {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  for (local_170 = 0; local_170 < local_1b0; local_170 = local_170 + 1) {
    if (((in_stack_00000018[local_170] < 1) || (local_e8[local_170] < in_stack_00000018[local_170]))
       || ((in_stack_00000020[local_170] < 1 || (local_e8[local_170] < in_stack_00000020[local_170])
           ))) {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  for (local_170 = 0; local_170 < local_1b8; local_170 = local_170 + 1) {
    if ((((in_stack_00000030[local_170] < 1) ||
         (local_128[local_170] < in_stack_00000030[local_170])) ||
        (in_stack_00000038[local_170] < 1)) || (local_128[local_170] < in_stack_00000038[local_170])
       ) {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  for (local_170 = 0; local_170 < local_1a8; local_170 = local_170 + 1) {
    if (in_stack_00000008[local_170] < local_50[local_170]) {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  for (local_170 = 0; local_170 < local_1b0; local_170 = local_170 + 1) {
    if (in_stack_00000020[local_170] < in_stack_00000018[local_170]) {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  for (local_170 = 0; local_170 < local_1b8; local_170 = local_170 + 1) {
    if (in_stack_00000038[local_170] < in_stack_00000030[local_170]) {
      pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    }
  }
  local_178 = (*in_stack_00000008 - *local_50) + 1;
  local_180 = (in_stack_00000008[1] - local_50[1]) + 1;
  local_170 = (in_stack_00000020[1] - in_stack_00000018[1]) + 1;
  if (local_180 != (*in_stack_00000020 - *in_stack_00000018) + 1) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  if ((local_178 != (*in_stack_00000038 - *in_stack_00000030) + 1) ||
     (local_170 != (in_stack_00000038[1] - in_stack_00000030[1]) + 1)) {
    pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  pnga_scale_patch(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                   in_stack_fffffffffffffc98);
  pnga_local_iterator_init(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  while (iVar4 = pnga_local_iterator_next
                           (in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                            (Integer *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                            ,in_stack_fffffffffffff850,
                            (Integer *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                           ), iVar4 != 0) {
    for (local_170 = 0; local_170 < local_1b8; local_170 = local_170 + 1) {
      local_278[local_170] = local_1f8[local_170];
      local_2b8[local_170] = local_238[local_170];
    }
    lVar5 = pnga_patch_intersect(local_1f8,local_238,local_278,local_2b8,local_1b8);
    if (lVar5 != 0) {
      local_758 = ((in_stack_00000008[1] - local_50[1]) + 1) / ((local_2b8[0] - local_278[0]) + 1);
      if (local_758 * ((local_2b8[0] - local_278[0]) + 1) < (in_stack_00000008[1] - local_50[1]) + 1
         ) {
        local_758 = local_758 + 1;
      }
      sVar1 = ga_types[local_58 + -1000].size;
      lVar6 = local_448 +
              sVar1 * ((local_2f8 * (local_278[1] - local_1f8[1]) + local_278[0]) - local_1f8[0]);
      __ptr = malloc(((local_2b8[0] - local_278[0]) + 1) * ((local_2b8[1] - local_278[1]) + 1) *
                     sVar1);
      __ptr_00 = malloc(((local_2b8[0] - local_278[0]) + 1) * ((local_2b8[1] - local_278[1]) + 1) *
                        sVar1);
      in_stack_fffffffffffff860 =
           (Integer *)(((local_2b8[0] - local_278[0]) + 1) * ((local_2b8[1] - local_278[1]) + 1));
      in_stack_fffffffffffff85c =
           (int)((local_278[0] - *in_stack_00000030) / ((local_2b8[0] - local_278[0]) + 1));
      for (local_188 = 0; lVar3 = local_278[0], local_188 < local_758; local_188 = local_188 + 1) {
        in_stack_fffffffffffff858 =
             (int)((long)(in_stack_fffffffffffff85c + (int)local_188) % local_758);
        lVar7 = local_50[1] + (long)in_stack_fffffffffffff858 * ((local_2b8[0] - local_278[0]) + 1);
        local_378 = local_2b8[0];
        local_370 = lVar7 + (local_2b8[0] - local_278[0]);
        if (in_stack_00000008[1] < local_370) {
          local_370 = in_stack_00000008[1];
        }
        uVar8 = ((local_2b8[0] - local_278[0]) + 1) * ((local_370 - lVar7) + 1);
        if ((long)in_stack_fffffffffffff860 < (long)uVar8) {
          uVar9 = pnga_nodeid();
          printf("p[%d] size_a: %d size_c: %d\n",uVar9 & 0xffffffff,uVar8 & 0xffffffff,
                 (ulong)in_stack_fffffffffffff860 & 0xffffffff);
        }
        pnga_get(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_3b0 = local_278[1];
        local_3f0 = local_2b8[1];
        local_3b8 = *in_stack_00000018 +
                    (long)in_stack_fffffffffffff858 * ((local_2b8[0] - local_278[0]) + 1);
        local_3f8 = local_3b8 + (local_2b8[0] - local_278[0]);
        if (*in_stack_00000020 < local_3f8) {
          local_3f8 = *in_stack_00000020;
        }
        in_stack_fffffffffffff868 =
             (_iterator_hdl *)(((local_3f8 - local_3b8) + 1) * ((local_2b8[1] - local_278[1]) + 1));
        if ((long)in_stack_fffffffffffff860 < (long)in_stack_fffffffffffff868) {
          uVar8 = pnga_nodeid();
          printf("p[%d] size_b: %d size_c: %d\n",uVar8 & 0xffffffff,
                 (ulong)in_stack_fffffffffffff868 & 0xffffffff,
                 (ulong)in_stack_fffffffffffff860 & 0xffffffff);
        }
        pnga_get(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_418 = (local_378 - lVar3) + 1;
        local_428 = (local_370 - lVar7) + 1;
        local_420 = (local_3f0 - local_3b0) + 1;
        local_430 = (local_378 - lVar3) + 1;
        local_438 = (local_3f8 - local_3b8) + 1;
        in_stack_fffffffffffff850 = (char **)(local_58 + -0x3eb);
        switch(in_stack_fffffffffffff850) {
        case (char **)0x0:
          in_stack_fffffffffffff848 = 1;
          gal_sgemm_(local_28,local_30,&local_418,&local_420,&local_428,local_38,__ptr,&local_430,
                     __ptr_00,&local_438,&local_410,lVar6,local_440,1);
          break;
        case (char **)0x1:
          in_stack_fffffffffffff848 = 1;
          gal_dgemm_(local_28,local_30,&local_418,&local_420,&local_428,local_38,__ptr,&local_430,
                     __ptr_00,&local_438,&local_408,lVar6,local_440,1);
          break;
        default:
          pnga_error(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
          break;
        case (char **)0x3:
          in_stack_fffffffffffff848 = 1;
          gal_cgemm_(local_28,local_30,&local_418,&local_420,&local_428,local_38,__ptr,&local_430,
                     __ptr_00,&local_438,&local_410,lVar6,local_440,1);
          break;
        case (char **)0x4:
          in_stack_fffffffffffff848 = 1;
          gal_zgemm_(local_28,local_30,&local_418,&local_420,&local_428,local_38,__ptr,&local_430,
                     __ptr_00,&local_438,&local_408,lVar6,local_440,1);
        }
      }
      free(__ptr);
      free(__ptr_00);
    }
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_matmul_basic(char *transa, char *transb, void *alpha, void *beta,
		                 Integer g_a, Integer alo[], Integer ahi[], 
                       Integer g_b, Integer blo[], Integer bhi[], 
		                 Integer g_c, Integer clo[], Integer chi[])
{
  Integer atype, btype, ctype;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
  Integer n, m, k, nb, adim, bdim, cdim, arank, brank, crank;
  Integer loC[MAXDIM], hiC[MAXDIM], lot[MAXDIM], hit[MAXDIM], lC[MAXDIM];
  Integer nlo, loA[MAXDIM], hiA[MAXDIM], loB[MAXDIM], hiB[MAXDIM];
  DoubleComplex ONE_Z;
  SingleComplex ONE_F;
  BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
  char *src_ptr;
  _iterator_hdl hdl_c;
  int local_sync_begin,local_sync_end;

  ONE_Z.real = 1.0;
  ONE_Z.imag = 0.0;
  ONE_F.real = 1.0;
  ONE_F.imag = 0.0;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* For the time being, punt on transposes*/
  if (*transa == 't' || *transa == 'T' || *transb == 't' || *transb == 'T') {
    pnga_error("Cannot do basic multiply with tranpose ",0);
  }
  /* For the time being, punt on mirrored arrays */
  if (pnga_is_mirrored(g_a) || pnga_is_mirrored(g_b) || pnga_is_mirrored(g_c)) {
    pnga_error("Cannot do basic multiply with mirrored arrays ",0);
  }


  pnga_inquire(g_a, &atype, &arank, adims);
  pnga_inquire(g_b, &btype, &brank, bdims);
  pnga_inquire(g_c, &ctype, &crank, cdims);

  /* Can't handle dimensions other than 2 */
  if(arank != 2)  pnga_error("rank of A must be 2 ",arank);
  if(brank != 2)  pnga_error("rank of B must be 2 ",brank);
  if(crank != 2)  pnga_error("rank of C must be 2 ",crank);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
  if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
    pnga_error(" type error: type not supported ",atype);

  /* Check that patch dims are reasonable */
  for (n=0; n<arank; n++) {
    if (alo[n] <= 0 || alo[n] > adims[n] || ahi[n] <= 0 || ahi[n] > adims[n]) {
      pnga_error("Patch is out of bounds for A ",0);
    }
  }
  for (n=0; n<brank; n++) {
    if (blo[n] <= 0 || blo[n] > bdims[n] || bhi[n] <= 0 || bhi[n] > bdims[n]) {
      pnga_error("Patch is out of bounds for B ",0);
    }
  }
  for (n=0; n<crank; n++) {
    if (clo[n] <= 0 || clo[n] > cdims[n] || chi[n] <= 0 || chi[n] > cdims[n]) {
      pnga_error("Patch is out of bounds for C ",0);
    }
  }

  /* Check that multiplication is feasible */
  for (n=0; n<arank; n++) {
    if (ahi[n]<alo[n]) pnga_error("No data in patch on A ",0);
  }

  for (n=0; n<brank; n++) {
    if (bhi[n]<blo[n]) pnga_error("No data in patch on B ",0);
  }
  for (n=0; n<crank; n++) {
    if (chi[n]<clo[n]) pnga_error("No data in patch on C ",0);
  }
  m = ahi[0]-alo[0]+1;
  k = ahi[1]-alo[1]+1;
  n = bhi[1]-blo[1]+1;
  if (k != bhi[0]-blo[0]+1) {
    pnga_error("Inner dimensions of A and B do not match ",0);
  }
  if (m != chi[0]-clo[0]+1 || n != chi[1]-clo[1]+1) {
    pnga_error("Outer dimensions of A and B do not match dimensions of C ",0);
  }

  /* Scale patch of C by beta */
  pnga_scale_patch(g_c,clo,chi,beta);

  /* Multiplication is feasible. Start iterating over patches of C */
  pnga_local_iterator_init(g_c, &hdl_c);
  while (pnga_local_iterator_next(&hdl_c, loC, hiC, &src_ptr, lC)) {
    Integer num_blocks;
    Integer offset, elemsize, ld;
    void *a_buf, *b_buf, *c_buf;
    Integer size_a, size_b, size_c;
    /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d lC[0]: %d\n",
        pnga_nodeid(),loC[0],hiC[0],loC[1],hiC[1],lC[0]);
        */
    /* Copy limits since patch intersect modifies loC array */
    for (n=0; n<crank; n++) {
      lot[n] = loC[n];
      hit[n] = hiC[n];
    }

    /* check to see if this block overlaps with patch on C */
    if (pnga_patch_intersect(loC,hiC,lot,hit,crank)) {
      int istart, in;

      /* Calculating number of blocks for inner dimension. Assume that 
       * number of rows in block returned by iterator is a good size */
      num_blocks = (ahi[1]-alo[1]+1)/(hit[0]-lot[0]+1);
      if (num_blocks*(hit[0]-lot[0]+1) < ahi[1]-alo[1]+1) num_blocks++;

      /* Calculate offset from  src_ptr to beginning of lot */ 
      offset = lC[0]*(lot[1]-loC[1])+lot[0]-loC[0];
      elemsize = GAsizeofM(atype);
      c_buf = (void*)((char*)src_ptr + elemsize*offset);
      a_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      b_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      size_c = (hit[0]-lot[0]+1)*(hit[1]-lot[1]+1);

      /* calculate starting block index */
      istart = (lot[0]-clo[0])/(hit[0]-lot[0]+1);

      /* loop over block pairs */
      for (nb=0; nb<num_blocks; nb++) {
        /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d\n",pnga_nodeid(),
        lot[0],hit[0],lot[1],hit[1]);
        */
        in = istart + nb;
        in = in%num_blocks;
        nlo = alo[1]+in*(hit[0]-lot[0]+1);
        loA[0] = lot[0];
        hiA[0] = hit[0];
        loA[1] = nlo;
        hiA[1] = loA[1]+(hit[0]-lot[0]);
        if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
        ld = hiA[0]-loA[0]+1;
        size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
        if (size_a > size_c) {
          printf("p[%d] size_a: %d size_c: %d\n",(int)pnga_nodeid(),(int)size_a,(int)size_c);
        }
        /*
    printf("p[%d] loA[0]: %d hiA[0]: %d loA[1]: %d hiA[1]: %d\n",pnga_nodeid(),
        loA[0],hiA[0],loA[1],hiA[1]);
        */
        pnga_get(g_a,loA,hiA,a_buf,&ld);
        /*
        printBlock("Matrix A",atype,a_buf,loA,hiA,&ld);
        */
        loB[1] = lot[1];
        hiB[1] = hit[1];
        nlo = blo[0]+in*(hit[0]-lot[0]+1);
        loB[0] = nlo;
        hiB[0] = loB[0]+(hit[0]-lot[0]);
        if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
        ld = hiB[0]-loB[0]+1;
        size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);
        if (size_b > size_c) {
          printf("p[%d] size_b: %d size_c: %d\n",(int)pnga_nodeid(),
              (int)size_b,(int)size_c);
        }
        /*
    printf("p[%d] loB[0]: %d hiB[0]: %d loB[1]: %d hiB[1]: %d\n",pnga_nodeid(),
        loB[0],hiB[0],loB[1],hiB[1]);
        */
        pnga_get(g_b,loB,hiB,b_buf,&ld);
        /*
        printBlock("Matrix B",btype,b_buf,loB,hiB,&ld);
        */

        idim_t=(BlasInt)(hiA[0]-loA[0]+1);
        kdim_t=(BlasInt)(hiA[1]-loA[1]+1);
        jdim_t=(BlasInt)(hiB[1]-loB[1]+1);
        adim_t=hiA[0]-loA[0]+1;
        bdim_t=hiB[0]-loB[0]+1;
        cdim_t=lC[0];

        /*
        printf("p[%d] idim: %d jdim: %d kdim: %d adim: %d bdim: %d cdim: %d\n",
            pnga_nodeid(),idim_t,jdim_t,kdim_t,adim_t,bdim_t,cdim_t);
            */
        switch(atype) {
          case C_FLOAT:
            BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (Real *)alpha, (Real *)a_buf, &adim_t,
                (Real *)b_buf, &bdim_t, (Real *)&ONE_F,
                (Real *)c_buf, &cdim_t);
            break;
          case C_DBL:
            BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoublePrecision *)alpha, (DoublePrecision *)a_buf, &adim_t,
                (DoublePrecision *)b_buf, &bdim_t, (DoublePrecision *)&ONE_Z,
                (DoublePrecision *)c_buf, &cdim_t);
            break;
          case C_DCPL:
            BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoubleComplex *)alpha, (DoubleComplex *)a_buf, &adim_t,
                (DoubleComplex *)b_buf, &bdim_t, (DoubleComplex *)&ONE_Z,
                (DoubleComplex *)c_buf, &cdim_t);
            break;
          case C_SCPL:
            BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (SingleComplex *)alpha, (SingleComplex *)a_buf, &adim_t,
                (SingleComplex *)b_buf, &bdim_t, (SingleComplex *)&ONE_F,
                (SingleComplex *)c_buf, &cdim_t);
            break;
		  default:
		    pnga_error("ga_matmul_basic: wrong data type", atype);
		  }
      }

      /* multiplication is done, free buffers */
      free(a_buf);
      free(b_buf);
    }
  }
  if(local_sync_end)pnga_sync(); 
}